

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButtonPrivate::onButtonPressed(QToolButtonPrivate *this)

{
  ToolButtonPopupMode TVar1;
  int iVar2;
  QToolButton *this_00;
  bool bVar3;
  
  this_00 = *(QToolButton **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  bVar3 = hasMenu(this);
  if ((bVar3) && (TVar1 = this->popupMode, TVar1 != MenuButtonPopup)) {
    iVar2 = this->delay;
    if (TVar1 == DelayedPopup && 0 < (long)iVar2) {
      QBasicTimer::start(&this->popupTimer,(long)iVar2 * 1000000,1,this_00);
      return;
    }
    if (TVar1 == InstantPopup || iVar2 == 0) {
      QToolButton::showMenu(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QToolButtonPrivate::onButtonPressed()
{
    Q_Q(QToolButton);
    if (!hasMenu())
        return; // no menu to show
    if (popupMode == QToolButton::MenuButtonPopup)
        return;
    else if (delay > 0 && popupMode == QToolButton::DelayedPopup)
        popupTimer.start(delay, q);
    else if (delay == 0 || popupMode == QToolButton::InstantPopup)
        q->showMenu();
}